

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDependsClosure
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaOuts *outputs,
          bool omit_self)

{
  _Base_ptr p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  TargetType TVar3;
  TargetDependSet *pTVar4;
  _Base_ptr p_Var5;
  const_iterator __pos;
  _Rb_tree_header *p_Var6;
  undefined1 __v [8];
  cmNinjaDeps outs;
  _Alloc_node __an;
  cmGeneratorTarget *local_70;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  size_t local_40;
  _Alloc_node local_38;
  
  p_Var6 = &(this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __pos._M_node = &p_Var6->_M_header;
  for (; p_Var1 != (_Base_ptr)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(cmGeneratorTarget **)(p_Var1 + 1) < target]) {
    if (*(cmGeneratorTarget **)(p_Var1 + 1) >= target) {
      __pos._M_node = p_Var1;
    }
  }
  local_70 = target;
  if (((_Rb_tree_header *)__pos._M_node == p_Var6) ||
     (*(cmGeneratorTarget **)(__pos._M_node + 1) != target)) {
    pTVar4 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    local_50 = (_Base_ptr)&pbStack_60;
    pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)pbStack_60 & 0xffffffff00000000);
    local_58 = (_Base_ptr)0x0;
    local_40 = 0;
    p_Var5 = (pTVar4->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pTVar4->
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)
              ._M_t._M_impl.super__Rb_tree_header;
    local_48 = local_50;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        TVar3 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var5 + 1));
        if (TVar3 != INTERFACE_LIBRARY) {
          AppendTargetDependsClosure
                    (this,*(cmGeneratorTarget **)(p_Var5 + 1),(cmNinjaOuts *)local_68,false);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
         ::
         _M_emplace_hint_unique<cmGeneratorTarget_const*&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   ((_Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
                     *)&this->TargetDependsClosures,__pos,&local_70,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)outputs,__pos._M_node[2],
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&__pos._M_node[1]._M_left);
  local_68 = (undefined1  [8])0x0;
  pbStack_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (_Base_ptr)0x0;
  if (!omit_self) {
    AppendTargetOutputs(this,local_70,(cmNinjaDeps *)local_68,DependOnTargetArtifact);
  }
  pbVar2 = pbStack_60;
  local_38._M_t = &outputs->_M_t;
  if (local_68 != (undefined1  [8])pbStack_60) {
    __v = local_68;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)outputs,(const_iterator)&(outputs->_M_t)._M_impl.super__Rb_tree_header,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,&local_38)
      ;
      __v = (undefined1  [8])((long)__v + 0x20);
    } while (__v != (undefined1  [8])pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDependsClosure(
  cmGeneratorTarget const* target, cmNinjaOuts& outputs, bool omit_self)
{

  // try to locate the target in the cache
  auto find = this->TargetDependsClosures.lower_bound(target);

  if (find == this->TargetDependsClosures.end() || find->first != target) {
    // We now calculate the closure outputs by inspecting the dependent
    // targets recursively.
    // For that we have to distinguish between a local result set that is only
    // relevant for filling the cache entries properly isolated and a global
    // result set that is relevant for the result of the top level call to
    // AppendTargetDependsClosure.
    auto const& targetDeps = this->GetTargetDirectDepends(target);
    cmNinjaOuts this_outs; // this will be the new cache entry

    for (auto const& dep_target : targetDeps) {
      if (dep_target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }

      // Collect the dependent targets for _this_ target
      this->AppendTargetDependsClosure(dep_target, this_outs, false);
    }
    find = this->TargetDependsClosures.emplace_hint(find, target,
                                                    std::move(this_outs));
  }

  // now fill the outputs of the final result from the newly generated cache
  // entry
  outputs.insert(find->second.begin(), find->second.end());

  // finally generate the outputs of the target itself, if applicable
  cmNinjaDeps outs;
  if (!omit_self) {
    this->AppendTargetOutputs(target, outs);
  }
  outputs.insert(outs.begin(), outs.end());
}